

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall TileWire::updateWire(TileWire *this,State state)

{
  char *pcVar1;
  uint uVar2;
  undefined1 *puVar3;
  int j;
  long lVar4;
  long lVar5;
  
  if ((long)(int)this->_type == 4) {
    uVar2 = this->_updateTimestamp1;
    if (this->_updateTimestamp1 != Tile::currentUpdateTime) {
      (*(this->super_Tile)._vptr_Tile[9])(this,0,state);
      uVar2 = Tile::currentUpdateTime;
    }
    if (this->_updateTimestamp2 != uVar2) {
      lVar5 = 1;
LAB_00137c0d:
      (*(this->super_Tile)._vptr_Tile[9])(this,lVar5,state);
      return;
    }
  }
  else {
    puVar3 = &(&this->super_Tile)[(long)(int)(this->super_Tile)._direction * 2].field_0x21 +
             (long)(int)this->_type * 0x10;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      lVar4 = 0;
      while (lVar4 != 4) {
        pcVar1 = puVar3 + lVar4;
        lVar4 = lVar4 + 1;
        if (*pcVar1 == '\x01') goto LAB_00137c0d;
      }
      puVar3 = puVar3 + 4;
    }
  }
  return;
}

Assistant:

void TileWire::updateWire(State state) {
    if (_type == CROSSOVER) {
        if (_updateTimestamp1 != Tile::currentUpdateTime) {    // For crossover, check both paths for update time mismatch.
            followWire(NORTH, state);
        }
        if (_updateTimestamp2 != Tile::currentUpdateTime) {
            followWire(EAST, state);
        }
    } else {
        for (int i = 0; i < 4; ++i) {    // Check combinations of entry and exit directions through this wire until one works out.
            const bool* exitDirections = CONNECTION_INFO[_direction][_type][i];
            for (int j = 0; j < 4; ++j) {
                if (exitDirections[j] == true) {
                    followWire(static_cast<Direction>(i), state);
                    return;
                }
            }
        }
    }
}